

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O3

bool Host_CheckForConnects(void *userdata)

{
  in_addr_t iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  in_port_t iVar5;
  in_addr iVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  sockaddr_in *psVar10;
  short sVar11;
  int iVar12;
  int num_needed;
  PreGamePacket packet;
  char local_74;
  char local_73;
  
  psVar10 = PreGet(&local_74,0x44,false);
  num_needed = (int)userdata;
  if (psVar10 != (sockaddr_in *)0x0) {
    do {
      if (local_74 == '0') {
        if (local_73 == '\x02') {
          uVar9 = FindNode(psVar10);
          if (-1 < (int)uVar9) {
            (*StartScreen->_vptr_FStartupScreen[7])
                      (StartScreen,"Got disconnect from node %d.",(ulong)uVar9);
            sVar11 = doomcom.numnodes + -1;
            doomcom.numnodes = sVar11;
            iVar12 = (int)sVar11;
            if ((int)uVar9 < iVar12) {
              psVar10 = sendaddress + (ulong)uVar9 + 1;
              do {
                iVar5 = psVar10->sin_port;
                iVar6.s_addr = (psVar10->sin_addr).s_addr;
                uVar4 = *(undefined8 *)psVar10->sin_zero;
                psVar10[-1].sin_family = psVar10->sin_family;
                psVar10[-1].sin_port = iVar5;
                psVar10[-1].sin_addr = (in_addr)iVar6.s_addr;
                *(undefined8 *)psVar10[-1].sin_zero = uVar4;
                psVar10 = psVar10 + 1;
                uVar9 = uVar9 + 1;
              } while ((int)uVar9 < iVar12);
            }
LAB_004ec60a:
            SendConAck(iVar12,num_needed);
          }
        }
        else if (local_73 == '\0') {
          iVar8 = FindNode(psVar10);
          iVar12 = (int)doomcom.numnodes;
          if (iVar12 != num_needed) {
            if (iVar8 == -1) {
              doomcom.numnodes = doomcom.numnodes + 1;
              iVar5 = psVar10->sin_port;
              iVar1 = (psVar10->sin_addr).s_addr;
              uVar2 = *(undefined4 *)psVar10->sin_zero;
              uVar3 = *(undefined4 *)(psVar10->sin_zero + 4);
              sendaddress[iVar12].sin_family = psVar10->sin_family;
              sendaddress[iVar12].sin_port = iVar5;
              sendaddress[iVar12].sin_addr.s_addr = iVar1;
              *(undefined4 *)sendaddress[iVar12].sin_zero = uVar2;
              *(undefined4 *)(sendaddress[iVar12].sin_zero + 4) = uVar3;
              (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Got connect from node %d.");
              iVar12 = (int)doomcom.numnodes;
            }
            goto LAB_004ec60a;
          }
          if (iVar8 == -1) {
            (*StartScreen->_vptr_FStartupScreen[7])
                      (StartScreen,"Got extra connect from %d.%d.%d.%d:%d",
                       (ulong)(byte)(psVar10->sin_addr).s_addr,
                       (ulong)*(byte *)((long)&(psVar10->sin_addr).s_addr + 1),
                       (ulong)*(byte *)((long)&(psVar10->sin_addr).s_addr + 2),
                       (ulong)*(byte *)((long)&(psVar10->sin_addr).s_addr + 3),
                       (uint)psVar10->sin_port);
            local_73 = '\x05';
            sendto(mysocket,&local_74,2,0,(sockaddr *)psVar10,0x10);
          }
        }
      }
      psVar10 = PreGet(&local_74,0x44,false);
    } while (psVar10 != (sockaddr_in *)0x0);
  }
  if (doomcom.numnodes < num_needed) {
    SendConAck((int)doomcom.numnodes,num_needed);
    bVar7 = false;
  }
  else {
    do {
      psVar10 = PreGet(&local_74,0x44,false);
      if (psVar10 == (sockaddr_in *)0x0) goto LAB_004ec6b8;
    } while ((local_74 != '0') || (local_73 != '\x02'));
    uVar9 = FindNode(psVar10);
    if (-1 < (int)uVar9) {
      sVar11 = doomcom.numnodes + -1;
      doomcom.numnodes = sVar11;
      iVar12 = (int)sVar11;
      if ((int)uVar9 < iVar12) {
        psVar10 = sendaddress + (ulong)uVar9 + 1;
        do {
          iVar5 = psVar10->sin_port;
          iVar6.s_addr = (psVar10->sin_addr).s_addr;
          uVar4 = *(undefined8 *)psVar10->sin_zero;
          psVar10[-1].sin_family = psVar10->sin_family;
          psVar10[-1].sin_port = iVar5;
          psVar10[-1].sin_addr = (in_addr)iVar6.s_addr;
          *(undefined8 *)psVar10[-1].sin_zero = uVar4;
          psVar10 = psVar10 + 1;
          uVar9 = uVar9 + 1;
        } while ((int)uVar9 < iVar12);
      }
      SendConAck(iVar12,num_needed);
    }
LAB_004ec6b8:
    bVar7 = num_needed <= doomcom.numnodes;
  }
  return bVar7;
}

Assistant:

bool Host_CheckForConnects (void *userdata)
{
	PreGamePacket packet;
	int numplayers = (int)(intptr_t)userdata;
	sockaddr_in *from;
	int node;

	while ( (from = PreGet (&packet, sizeof(packet), false)) )
	{
		if (packet.Fake != PRE_FAKE)
		{
			continue;
		}
		switch (packet.Message)
		{
		case PRE_CONNECT:
			node = FindNode (from);
			if (doomcom.numnodes == numplayers)
			{
				if (node == -1)
				{
					const BYTE *s_addr_bytes = (const BYTE *)&from->sin_addr;
					StartScreen->NetMessage ("Got extra connect from %d.%d.%d.%d:%d",
						s_addr_bytes[0], s_addr_bytes[1], s_addr_bytes[2], s_addr_bytes[3],
						from->sin_port);
					packet.Message = PRE_ALLFULL;
					PreSend (&packet, 2, from);
				}
			}
			else
			{
				if (node == -1)
				{
					node = doomcom.numnodes++;
					sendaddress[node] = *from;
					StartScreen->NetMessage ("Got connect from node %d.", node);
				}

				// Let the new guest (and everyone else) know we got their message.
				SendConAck (doomcom.numnodes, numplayers);
			}
			break;

		case PRE_DISCONNECT:
			node = FindNode (from);
			if (node >= 0)
			{
				StartScreen->NetMessage ("Got disconnect from node %d.", node);
				doomcom.numnodes--;
				while (node < doomcom.numnodes)
				{
					sendaddress[node] = sendaddress[node+1];
					node++;
				}

				// Let remaining guests know that somebody left.
				SendConAck (doomcom.numnodes, numplayers);
			}
			break;

		case PRE_KEEPALIVE:
			break;
		}
	}
	if (doomcom.numnodes < numplayers)
	{
		// Send message to everyone as a keepalive
		SendConAck(doomcom.numnodes, numplayers);
		return false;
	}

	// It's possible somebody bailed out after all players were found.
	// Unfortunately, this isn't guaranteed to catch all of them.
	// Oh well. Better than nothing.
	while ( (from = PreGet (&packet, sizeof(packet), false)) )
	{
		if (packet.Fake == PRE_FAKE && packet.Message == PRE_DISCONNECT)
		{
			node = FindNode (from);
			if (node >= 0)
			{
				doomcom.numnodes--;
				while (node < doomcom.numnodes)
				{
					sendaddress[node] = sendaddress[node+1];
					node++;
				}
				// Let remaining guests know that somebody left.
				SendConAck (doomcom.numnodes, numplayers);
			}
			break;
		}
	}
	return doomcom.numnodes >= numplayers;
}